

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O0

uint64_t MurmurHash64A(void *key,int len,uint64_t seed)

{
  ulong uVar1;
  uchar *data2;
  uint64_t k;
  uint64_t *end;
  uint64_t *data;
  uint64_t h;
  int r;
  uint64_t m;
  uint64_t seed_local;
  int len_local;
  void *key_local;
  
  h = seed ^ (long)len * -0x395b586ca42e166b;
  for (data = (uint64_t *)key; data != (uint64_t *)((long)key + (long)(len / 8) * 8);
      data = data + 1) {
    h = ((*data * -0x395b586ca42e166b >> 0x2f ^ *data * -0x395b586ca42e166b) * -0x395b586ca42e166b ^
        h) * -0x395b586ca42e166b;
  }
  switch(len & 7) {
  case 7:
    h = (ulong)*(byte *)((long)data + 6) << 0x30 ^ h;
  case 6:
    h = (ulong)*(byte *)((long)data + 5) << 0x28 ^ h;
  case 5:
    h = (ulong)*(byte *)((long)data + 4) << 0x20 ^ h;
  case 4:
    h = (ulong)*(byte *)((long)data + 3) << 0x18 ^ h;
  case 3:
    h = (ulong)*(byte *)((long)data + 2) << 0x10 ^ h;
  case 2:
    h = (ulong)*(byte *)((long)data + 1) << 8 ^ h;
  case 1:
    h = ((byte)*data ^ h) * -0x395b586ca42e166b;
  default:
    uVar1 = (h >> 0x2f ^ h) * -0x395b586ca42e166b;
    return uVar1 >> 0x2f ^ uVar1;
  }
}

Assistant:

uint64_t MurmurHash64A ( const void * key, int len, uint64_t seed )
{
  const uint64_t m = BIG_CONSTANT(0xc6a4a7935bd1e995);
  const int r = 47;

  uint64_t h = seed ^ (len * m);

  const uint64_t * data = (const uint64_t *)key;
  const uint64_t * end = data + (len/8);

  while(data != end)
  {
    uint64_t k = *data++;

    k *= m; 
    k ^= k >> r; 
    k *= m; 
    
    h ^= k;
    h *= m; 
  }

  const unsigned char * data2 = (const unsigned char*)data;

  switch(len & 7)
  {
  case 7: h ^= uint64_t(data2[6]) << 48;
  case 6: h ^= uint64_t(data2[5]) << 40;
  case 5: h ^= uint64_t(data2[4]) << 32;
  case 4: h ^= uint64_t(data2[3]) << 24;
  case 3: h ^= uint64_t(data2[2]) << 16;
  case 2: h ^= uint64_t(data2[1]) << 8;
  case 1: h ^= uint64_t(data2[0]);
          h *= m;
  };
 
  h ^= h >> r;
  h *= m;
  h ^= h >> r;

  return h;
}